

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

char fsnav_init_gnss_gal(fsnav_gnss_gal *gal,size_t max_sat_count,size_t max_eph_count)

{
  undefined8 *puVar1;
  char cVar2;
  fsnav_gnss_sat *pfVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  
  pfVar3 = (fsnav_gnss_sat *)calloc(max_sat_count,0x90);
  gal->max_sat_count = 0;
  gal->max_eph_count = 0;
  gal->sat = pfVar3;
  if (pfVar3 == (fsnav_gnss_sat *)0x0) {
LAB_0010673e:
    cVar2 = '\0';
  }
  else {
    gal->max_sat_count = max_sat_count;
    if (max_sat_count != 0) {
      lVar4 = 0x80;
      uVar6 = 0;
      do {
        pfVar3 = gal->sat;
        *(undefined8 *)((long)pfVar3 + lVar4 + -0x80) = 0;
        *(undefined1 *)((long)pfVar3 + lVar4 + -0x78) = 0;
        *(undefined8 *)((long)pfVar3 + lVar4 + -0x70) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar4 + -0x68) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar4 + -0x48) = 0;
        *(undefined1 *)((long)pfVar3 + lVar4 + -0x58) = 0;
        *(undefined1 *)((long)pfVar3->x + lVar4 + -0x38) = 0;
        puVar1 = (undefined8 *)((long)pfVar3->x + lVar4 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        uVar6 = uVar6 + 1;
        uVar7 = gal->max_sat_count;
        lVar4 = lVar4 + 0x90;
      } while (uVar6 < uVar7);
      if (uVar7 != 0) {
        pfVar3 = gal->sat;
        do {
          pdVar5 = (double *)calloc(max_eph_count,8);
          pfVar3->eph = pdVar5;
          if (pdVar5 == (double *)0x0) goto LAB_0010673e;
          pfVar3 = pfVar3 + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    gal->max_eph_count = max_eph_count;
    gal->iono_valid = '\0';
    gal->clock_corr_valid = '\0';
    gal->obs_types = (char (*) [4])0x0;
    gal->obs_count = 0;
    cVar2 = '\x01';
  }
  return cVar2;
}

Assistant:

char fsnav_init_gnss_gal(fsnav_gnss_gal* gal, const size_t max_sat_count, const size_t max_eph_count)
{
	size_t i;

	gal->sat = NULL;
	gal->max_sat_count = 0;
	gal->max_eph_count = 0;

	// try to allocate memory for satellite data
	gal->sat = (fsnav_gnss_sat*)calloc(max_sat_count, sizeof(fsnav_gnss_sat));
	if (gal->sat == NULL)
		return 0;
	gal->max_sat_count = max_sat_count;

	// initialize satellite data
	for (i = 0; i < gal->max_sat_count; i++) 
		fsnav_init_gnss_sat(gal->sat + i);

	// try to allocate memory for each satellite ephemeris
	for (i = 0; i < gal->max_sat_count; i++) {
		gal->sat[i].eph = (double*)calloc(max_eph_count, sizeof(double));
		if (gal->sat[i].eph == NULL)
			return 0;
	}
	gal->max_eph_count = max_eph_count;

	// observation types
	gal->obs_types = NULL;
	gal->obs_count = 0;

	// validity flags
	gal->iono_valid = 0;
	gal->clock_corr_valid = 0;

	return 1;
}